

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O2

void Cec_ManCecSetDefaultParams(Cec_ParCec_t *p)

{
  p->fNaive = 0;
  p->fSilent = 0;
  p->fVeryVerbose = 0;
  p->fVerbose = 0;
  p->nBTLimit = 1000;
  p->TimeLimit = 0;
  p->fUseSmartCnf = 0;
  p->fRewriting = 0;
  p->iOutFail = -1;
  return;
}

Assistant:

void Cec_ManCecSetDefaultParams( Cec_ParCec_t * p )
{
    memset( p, 0, sizeof(Cec_ParCec_t) );
    p->nBTLimit       =    1000;  // conflict limit at a node
    p->TimeLimit      =       0;  // the runtime limit in seconds
//    p->fFirstStop     =       0;  // stop on the first sat output
    p->fUseSmartCnf   =       0;  // use smart CNF computation
    p->fRewriting     =       0;  // enables AIG rewriting
    p->fVeryVerbose   =       0;  // verbose stats
    p->fVerbose       =       0;  // verbose stats
    p->iOutFail       =      -1;  // the number of failed output
}